

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfConvert.cpp
# Opt level: O1

uint Imf_2_5::halfToUint(half h)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((-1 < (short)h._h) && ((~h._h & 0x7c00) != 0 || (h._h & 0x3ff) == 0)) {
    uVar1 = 0xffffffff;
    if (h._h != 0x7c00) {
      uVar1 = (uint)(long)*(float *)((long)&half::_toFloat + (ulong)(uint)h._h * 4);
    }
  }
  return uVar1;
}

Assistant:

unsigned int
halfToUint (half h)
{
    if (h.isNegative() || h.isNan())
	return 0;

    if (h.isInfinity())
	return UINT_MAX;

    return (unsigned int) h;
}